

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall QTextStream::skipWhiteSpace(QTextStream *this)

{
  long lVar1;
  QTextStreamPrivate *function;
  QTextStreamPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  TokenDelimiter in_stack_0000002c;
  qsizetype in_stack_00000030;
  qsizetype *in_stack_00000038;
  QChar **in_stack_00000040;
  QTextStreamPrivate *in_stack_00000048;
  char *in_stack_ffffffffffffffd8;
  QMessageLogger *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  function = d_func((QTextStream *)0x4a8095);
  if ((function->string == (QString *)0x0) && (function->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20),
               (char *)function);
    QMessageLogger::warning((QMessageLogger *)&stack0xffffffffffffffd8,"QTextStream: No device");
  }
  else {
    QTextStreamPrivate::scan
              (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,
               in_stack_0000002c);
    QTextStreamPrivate::consumeLastToken(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStream::skipWhiteSpace()
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(Q_VOID);
    d->scan(nullptr, nullptr, 0, QTextStreamPrivate::NotSpace);
    d->consumeLastToken();
}